

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,int>>::emplace<std::pair<QModelIndex,int>const&>
          (QMovableArrayOps<std::pair<QModelIndex,int>> *this,qsizetype i,
          pair<QModelIndex,_int> *args)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  quintptr qVar12;
  QAbstractItemModel *pQVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  
  piVar9 = *(int **)this;
  if ((piVar9 == (int *)0x0) || (1 < *piVar9)) {
LAB_005ab3a8:
    iVar6 = (args->first).r;
    iVar7 = (args->first).c;
    qVar12 = (args->first).i;
    pQVar13 = (args->first).m.ptr;
    iVar8 = args->second;
    uVar2 = args->field_0x1c;
    uVar3 = args->field_0x1d;
    uVar4 = args->field_0x1e;
    uVar5 = args->field_0x1f;
    lVar10 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QModelIndex,_int>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QModelIndex,_int>_> *)this,(uint)(i == 0 && lVar10 != 0)
               ,1,(pair<QModelIndex,_int> **)0x0,
               (QArrayDataPointer<std::pair<QModelIndex,_int>_> *)0x0);
    lVar14 = *(long *)(this + 8);
    if (i != 0 || lVar10 == 0) {
      piVar9 = (int *)(lVar14 + i * 0x20);
      memmove(piVar9 + 8,(void *)(lVar14 + i * 0x20),(*(long *)(this + 0x10) - i) * 0x20);
      *piVar9 = iVar6;
      piVar9[1] = iVar7;
      *(quintptr *)(piVar9 + 2) = qVar12;
      *(QAbstractItemModel **)(piVar9 + 4) = pQVar13;
      piVar9[6] = iVar8;
      *(undefined1 *)(piVar9 + 7) = uVar2;
      *(undefined1 *)((long)piVar9 + 0x1d) = uVar3;
      *(undefined1 *)((long)piVar9 + 0x1e) = uVar4;
      *(undefined1 *)((long)piVar9 + 0x1f) = uVar5;
      goto LAB_005ab4bd;
    }
    *(int *)(lVar14 + -0x20) = iVar6;
    *(int *)(lVar14 + -0x1c) = iVar7;
    *(quintptr *)(lVar14 + -0x18) = qVar12;
    *(QAbstractItemModel **)(lVar14 + -0x10) = pQVar13;
    *(int *)(lVar14 + -8) = iVar8;
    *(undefined1 *)(lVar14 + -4) = uVar2;
    *(undefined1 *)(lVar14 + -3) = uVar3;
    *(undefined1 *)(lVar14 + -2) = uVar4;
    *(undefined1 *)(lVar14 + -1) = uVar5;
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar10 = *(long *)(this + 8),
       *(long *)(piVar9 + 2) !=
       ((long)(lVar10 - ((long)piVar9 + 0x1fU & 0xfffffffffffffff0)) >> 5) + i)) {
      uVar15 = *(undefined8 *)&args->first;
      qVar12 = (args->first).i;
      uVar16 = *(undefined8 *)&args->second;
      puVar1 = (undefined8 *)(lVar10 + 0x10 + i * 0x20);
      *puVar1 = (args->first).m.ptr;
      puVar1[1] = uVar16;
      puVar1 = (undefined8 *)(lVar10 + i * 0x20);
      *puVar1 = uVar15;
      puVar1[1] = qVar12;
      goto LAB_005ab4bd;
    }
    if ((i != 0) ||
       (uVar11 = *(ulong *)(this + 8), ((long)piVar9 + 0x1fU & 0xfffffffffffffff0) == uVar11))
    goto LAB_005ab3a8;
    uVar15 = *(undefined8 *)&args->first;
    qVar12 = (args->first).i;
    uVar16 = *(undefined8 *)&args->second;
    *(QAbstractItemModel **)(uVar11 - 0x10) = (args->first).m.ptr;
    *(undefined8 *)(uVar11 - 8) = uVar16;
    *(undefined8 *)(uVar11 - 0x20) = uVar15;
    *(quintptr *)(uVar11 - 0x18) = qVar12;
  }
  *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
LAB_005ab4bd:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }